

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O1

int __thiscall SongListModel::remove(SongListModel *this,char *__filename)

{
  int extraout_EAX;
  Module *this_00;
  SongList *this_01;
  Song *song;
  int index;
  PermanentEditor editor;
  PermanentEditor local_38;
  
  local_38.super_Editor.super_QMutexLocker<QMutex>.m = (QMutex *)0xffffffffffffffff;
  local_38.super_Editor.super_QMutexLocker<QMutex>.isLocked = false;
  local_38.super_Editor.super_QMutexLocker<QMutex>._9_7_ = 0;
  local_38.mModule = (Module *)0x0;
  index = (int)__filename;
  QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_38,index);
  Module::permanentEdit(&local_38,this->mModule);
  this_00 = Module::data(this->mModule);
  this_01 = trackerboy::Module::songs(this_00);
  song = trackerboy::SongList::get(this_01,index);
  trackerboy::SongList::remove(this_01,(char *)((ulong)__filename & 0xffffffff));
  std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>::_M_erase
            (&this->mSongData,
             (this->mSongData).
             super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>.
             _M_impl.super__Vector_impl_data._M_start + index);
  Module::PermanentEditor::~PermanentEditor(&local_38);
  QAbstractItemModel::endRemoveRows();
  Module::removeHistory(this->mModule,song);
  return extraout_EAX;
}

Assistant:

void SongListModel::remove(int index) {
    trackerboy::Song *removedSong;
    beginRemoveRows(QModelIndex(), index, index);
    {
        auto editor = mModule.permanentEdit();
        auto &songs = mModule.data().songs();
        removedSong = songs.get(index);
        songs.remove(index);
        mSongData.erase(mSongData.begin() + index);
    }

    endRemoveRows();

    // now remove the history for the song (if exists)
    mModule.removeHistory(removedSong);
}